

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::draw2dTextAt3dLocation(char *text,Vec3 *location,Color *color,float w,float h)

{
  int in_ECX;
  Color *in_RDX;
  GLfloat *in_RSI;
  char *in_RDI;
  char *in_R8;
  int in_R9D;
  GLfloat extraout_XMM0_Da;
  float fVar1;
  float fVar2;
  int vOffset;
  int fontHeight;
  char *p;
  int lines;
  GLint originalMatrixMode;
  GLint rasterPosition [4];
  int in_stack_ffffffffffffff98;
  PFNGLCOLOR3FPROC p_Var3;
  char *local_48;
  int local_40;
  GLint local_38;
  int local_34;
  Color *local_18;
  GLfloat *local_10;
  char *local_8;
  
  p_Var3 = glad_glColor3f;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Color::r(in_RDX,in_RSI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_ffffffffffffff98);
  fVar1 = Color::g(local_18);
  fVar2 = Color::b(local_18);
  (*p_Var3)(extraout_XMM0_Da,fVar1,fVar2);
  (*glad_glRasterPos3f)(*local_10,local_10[1],local_10[2]);
  (*glad_glGetIntegerv)(0xb07,&local_38);
  anon_unknown.dwarf_1485b::begin2dDrawing((float)((ulong)p_Var3 >> 0x20),SUB84(p_Var3,0));
  local_40 = 0;
  for (local_48 = local_8; *local_48 != '\0'; local_48 = local_48 + 1) {
    if (*local_48 == '\n') {
      local_40 = local_40 + 1;
      (*glad_glRasterPos2i)(local_38,local_34 + local_40 * -0x10);
    }
  }
  anon_unknown.dwarf_1485b::end2dDrawing(0);
  return;
}

Assistant:

void 
OpenSteer::draw2dTextAt3dLocation (const char& text,
                                   const Vec3& location,
                                   const Color& color, float w, float h)
{
    // XXX NOTE: "it would be nice if" this had a 2d screenspace offset for
    // the origin of the text relative to the screen space projection of
    // the 3d point.

    // set text color and raster position
    glColor3f (color.r(), color.g(), color.b());
    glRasterPos3f (location.x, location.y, location.z);

    // switch into 2d screen space in case we need to handle a new-line
    GLint rasterPosition[4];
    glGetIntegerv (GL_CURRENT_RASTER_POSITION, rasterPosition);
    const GLint originalMatrixMode = begin2dDrawing (w, h);

    //xxx uncommenting this causes the "2d" version to print the wrong thing
    //xxx with it out the first line of a multi-line "3d" string jiggles
    //glRasterPos2i (rasterPosition[0], rasterPosition[1]);

    // loop over each character in string (until null terminator)
    int lines = 0;
    for (const char* p = &text; *p; p++)
    {
        if (*p == '\n')
        {
            // handle new-line character, reset raster position
            lines++;
            const int fontHeight = 15; // for GLUT_BITMAP_9_BY_15
            const int vOffset = lines * (fontHeight + 1);
            glRasterPos2i (rasterPosition[0], rasterPosition[1] - vOffset);
        }
        else
        {
            // otherwise draw character bitmap
            #ifndef HAVE_NO_GLUT
                //glutBitmapCharacter (GLUT_BITMAP_9_BY_15, *p);
            #else
                // no character drawing with GLUT presently
            #endif
        }
    }

    // switch back out of 2d screen space
    end2dDrawing (originalMatrixMode);
}